

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundostack.cpp
# Opt level: O0

bool __thiscall QUndoStackPrivate::checkUndoLimit(QUndoStackPrivate *this)

{
  bool bVar1;
  int iVar2;
  qsizetype qVar3;
  long in_RDI;
  int i;
  int del_count;
  value_type in_stack_ffffffffffffffd0;
  int local_18;
  bool local_1;
  
  if (((*(int *)(in_RDI + 0xb8) < 1) ||
      (bVar1 = QList<QUndoCommand_*>::isEmpty((QList<QUndoCommand_*> *)0xa822f1), !bVar1)) ||
     (iVar2 = *(int *)(in_RDI + 0xb8),
     qVar3 = QList<QUndoCommand_*>::size((QList<QUndoCommand_*> *)(in_RDI + 0x78)), qVar3 <= iVar2))
  {
    local_1 = false;
  }
  else {
    qVar3 = QList<QUndoCommand_*>::size((QList<QUndoCommand_*> *)(in_RDI + 0x78));
    iVar2 = (int)qVar3 - *(int *)(in_RDI + 0xb8);
    for (local_18 = 0; local_18 < iVar2; local_18 = local_18 + 1) {
      in_stack_ffffffffffffffd0 =
           QList<QUndoCommand_*>::takeFirst((QList<QUndoCommand_*> *)in_stack_ffffffffffffffd0);
      if (in_stack_ffffffffffffffd0 != (value_type)0x0) {
        (*in_stack_ffffffffffffffd0->_vptr_QUndoCommand[1])();
      }
    }
    *(int *)(in_RDI + 0xa8) = *(int *)(in_RDI + 0xa8) - iVar2;
    if (*(int *)(in_RDI + 0xac) != -1) {
      if (*(int *)(in_RDI + 0xac) < iVar2) {
        *(undefined4 *)(in_RDI + 0xac) = 0xffffffff;
      }
      else {
        *(int *)(in_RDI + 0xac) = *(int *)(in_RDI + 0xac) - iVar2;
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool QUndoStackPrivate::checkUndoLimit()
{
    if (undo_limit <= 0 || !macro_stack.isEmpty() || undo_limit >= command_list.size())
        return false;

    int del_count = command_list.size() - undo_limit;

    for (int i = 0; i < del_count; ++i)
        delete command_list.takeFirst();

    index -= del_count;
    if (clean_index != -1) {
        if (clean_index < del_count)
            clean_index = -1; // we've deleted the clean command
        else
            clean_index -= del_count;
    }

    return true;
}